

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

cell * implementations::scheme::read_from
                 (cell *__return_storage_ptr__,
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *tokens)

{
  bool bVar1;
  string token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  cell local_80;
  
  std::__cxx11::string::string
            ((string *)&local_a0,
             (string *)
             ((tokens->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front(tokens);
  bVar1 = std::operator==(&local_a0,"(");
  if (bVar1) {
    __return_storage_ptr__->type = List;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val)._M_string_length = 0;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->list).
    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->env).
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->env).
    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((tokens->
                               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1),")");
      if (!bVar1) break;
      read_from(&local_80,tokens);
      std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
      emplace_back<implementations::scheme::cell>(&__return_storage_ptr__->list,&local_80);
      cell::~cell(&local_80);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(tokens);
  }
  else {
    atom(__return_storage_ptr__,&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

cell read_from(std::list<std::string> & tokens)
{
	const std::string token(tokens.front());
	tokens.pop_front();
	if (token == "(") {
		cell c(List);
		while (tokens.front() != ")")
			c.list.push_back(read_from(tokens));
		tokens.pop_front();
		return c;
	} else
		return atom(token);
}